

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

void adios2::helper::SetParameterValue(string *key,Params *parameters,string *value)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&parameters->_M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node != &(parameters->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign((string *)value);
  }
  return;
}

Assistant:

void SetParameterValue(const std::string key, const Params &parameters, std::string &value) noexcept
{
    auto itKey = parameters.find(key);
    if (itKey != parameters.end())
    {
        value = itKey->second;
    }
}